

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng_test.cpp
# Opt level: O0

void __thiscall RNG_Int_Test::TestBody(RNG_Int_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int v;
  int i;
  int count;
  int zero;
  int negative;
  int positive;
  RNG rng;
  AssertHelper *in_stack_fffffffffffffe80;
  RNG *in_stack_fffffffffffffe88;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined8 in_stack_fffffffffffffe98;
  int line;
  char *in_stack_fffffffffffffea0;
  AssertionResult *this_02;
  Type in_stack_fffffffffffffeac;
  Type type;
  AssertHelper *in_stack_fffffffffffffeb0;
  Message *in_stack_fffffffffffffef8;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_f0 [2];
  double *in_stack_ffffffffffffff30;
  double *val2;
  int *in_stack_ffffffffffffff38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  AssertionResult local_a0 [2];
  double local_80;
  AssertionResult local_78 [3];
  double local_48;
  AssertionResult local_40;
  int32_t local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  RNG local_18;
  
  pbrt::RNG::RNG(&local_18);
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  local_28 = 10000;
  for (local_2c = 0; line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20), local_2c < local_28;
      local_2c = local_2c + 1) {
    local_30 = pbrt::RNG::Uniform<int>(in_stack_fffffffffffffe88);
    if (local_30 < 0) {
      local_20 = local_20 + 1;
    }
    else if (local_30 == 0) {
      local_24 = local_24 + 1;
    }
    else {
      local_1c = local_1c + 1;
    }
  }
  local_48 = (double)local_28 * 0.48;
  testing::internal::CmpHelperGT<int,double>
            (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40.ptr_,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x625bbe);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,line,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x625c1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x625c70);
  local_80 = (double)local_28 * 0.52;
  testing::internal::CmpHelperLT<int,double>
            (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40.ptr_,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x625d24);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,line,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x625d81);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x625dd6);
  testing::internal::CmpHelperGT<int,double>
            (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40.ptr_,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffeb0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x625e8a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,line,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x625ee7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x625f3c);
  val2 = (double *)((double)local_28 * 0.52);
  this_02 = (AssertionResult *)&stack0xffffffffffffff38;
  testing::internal::CmpHelperLT<int,double>
            (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40.ptr_,
             in_stack_ffffffffffffff38,val2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x625ff0);
    line = (int)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,type,&this_02->success_,line,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x62604d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x6260a2);
  this_01 = local_f0;
  testing::internal::CmpHelperLT<int,double>
            (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40.ptr_,
             in_stack_ffffffffffffff38,val2);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x626156)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,type,&this_02->success_,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x6261b3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x626208);
  return;
}

Assistant:

TEST(RNG, Int) {
    RNG rng;
    int positive = 0, negative = 0, zero = 0;
    int count = 10000;
    for (int i = 0; i < count; ++i) {
        int v = rng.Uniform<int>();
        if (v < 0)
            ++negative;
        else if (v == 0)
            ++zero;
        else
            ++positive;
    }

    EXPECT_GT(positive, .48 * count);
    EXPECT_LT(positive, .52 * count);
    EXPECT_GT(negative, .48 * count);
    EXPECT_LT(negative, .52 * count);
    EXPECT_LT(zero, .001 * count);
}